

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::getBasicPrimalInfeasibility(HEkkPrimal *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int *piVar5;
  double *__b;
  double *pdVar6;
  reference pvVar7;
  double *pdVar8;
  long *in_RDI;
  bool num_primal_infeasibility_ok;
  double primal_infeasibility;
  double upper;
  double lower;
  double value;
  HighsInt iRow;
  HighsInt updated_num_primal_infeasibility;
  double *sum_primal_infeasibility;
  double *max_primal_infeasibility;
  HighsInt *num_primal_infeasibility;
  HighsSimplexInfo *info;
  double primal_feasibility_tolerance;
  double in_stack_ffffffffffffffa8;
  HighsSimplexAnalysis *in_stack_ffffffffffffffb0;
  int local_38;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB84(in_stack_ffffffffffffffa8,0));
  dVar1 = *(double *)(*(long *)(*in_RDI + 8) + 0x118);
  lVar4 = *in_RDI;
  piVar5 = (int *)(lVar4 + 0x28d8);
  __b = (double *)(lVar4 + 0x28e0);
  pdVar6 = (double *)(lVar4 + 0x28e8);
  *piVar5 = 0;
  *__b = 0.0;
  *pdVar6 = 0.0;
  for (local_38 = 0; local_38 < *(int *)((long)in_RDI + 0x14); local_38 = local_38 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar4 + 0x2668),(long)local_38);
    dVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar4 + 0x2638),(long)local_38);
    dVar3 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar4 + 0x2650),(long)local_38);
    in_stack_ffffffffffffffb0 = (HighsSimplexAnalysis *)*pvVar7;
    in_stack_ffffffffffffffa8 = 0.0;
    if (dVar3 - dVar1 <= dVar2) {
      if ((double)in_stack_ffffffffffffffb0 + dVar1 < dVar2) {
        in_stack_ffffffffffffffa8 = dVar2 - (double)in_stack_ffffffffffffffb0;
      }
    }
    else {
      in_stack_ffffffffffffffa8 = dVar3 - dVar2;
    }
    if (0.0 < in_stack_ffffffffffffffa8) {
      if (dVar1 < in_stack_ffffffffffffffa8) {
        *piVar5 = *piVar5 + 1;
      }
      pdVar8 = std::max<double>((double *)&stack0xffffffffffffffa8,__b);
      *__b = *pdVar8;
      *pdVar6 = in_stack_ffffffffffffffa8 + *pdVar6;
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB84(in_stack_ffffffffffffffa8,0));
  return;
}

Assistant:

void HEkkPrimal::getBasicPrimalInfeasibility() {
  // Gets the num/max/sum of basic primal infeasibilities,
  analysis->simplexTimerStart(ComputePrIfsClock);
  const double primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsInt& num_primal_infeasibility = info.num_primal_infeasibilities;
  double& max_primal_infeasibility = info.max_primal_infeasibility;
  double& sum_primal_infeasibility = info.sum_primal_infeasibilities;
  const HighsInt updated_num_primal_infeasibility = num_primal_infeasibility;
  num_primal_infeasibility = 0;
  max_primal_infeasibility = 0;
  sum_primal_infeasibility = 0;

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double value = info.baseValue_[iRow];
    double lower = info.baseLower_[iRow];
    double upper = info.baseUpper_[iRow];
    // @primal_infeasibility calculation
    double primal_infeasibility = 0;
    if (value < lower - primal_feasibility_tolerance) {
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      primal_infeasibility = value - upper;
    }
    if (primal_infeasibility > 0) {
      if (primal_infeasibility > primal_feasibility_tolerance)
        num_primal_infeasibility++;
      max_primal_infeasibility =
          std::max(primal_infeasibility, max_primal_infeasibility);
      sum_primal_infeasibility += primal_infeasibility;
    }
  }
  if (updated_num_primal_infeasibility >= 0) {
    // The number of primal infeasibilities should be correct
    bool num_primal_infeasibility_ok =
        num_primal_infeasibility == updated_num_primal_infeasibility;
    // if (!num_primal_infeasibility_ok)
    //   printf("In iteration %" HIGHSINT_FORMAT
    //          ": num_primal_infeasibility = %" HIGHSINT_FORMAT
    //          " != %" HIGHSINT_FORMAT
    //          " = "
    //          "updated_num_primal_infeasibility\n",
    //          ekk_instance_.iteration_count_, num_primal_infeasibility,
    //          updated_num_primal_infeasibility);

    assert(num_primal_infeasibility_ok);
  }
  analysis->simplexTimerStop(ComputePrIfsClock);
}